

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O1

CloudNode * Lpk_CutTruthBdd(Lpk_Man_t *p,Lpk_Cut_t *pCut)

{
  int iVar1;
  CloudManager *dd;
  Hop_Man_t *pMan;
  Vec_Ptr_t *pVVar2;
  long *plVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  CloudNode *pCVar8;
  CloudNode *pCVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  
  dd = p->pDsdMan->dd;
  pMan = (Hop_Man_t *)p->pNtk->pManFunc;
  uVar12 = *(uint *)pCut;
  uVar11 = (ulong)(uVar12 & 0x3f);
  if ((uVar12 & 0x3f) != 0) {
    iVar6 = -1;
    uVar10 = 0;
    do {
      iVar1 = pCut->pLeaves[uVar10];
      if (((long)iVar1 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar1)) goto LAB_004e3e09;
      *(CloudNode **)((long)pVVar2->pArray[iVar1] + 0x40) = dd->vars[(int)uVar11 + iVar6];
      uVar10 = uVar10 + 1;
      uVar12 = *(uint *)pCut;
      uVar11 = (ulong)(uVar12 & 0x3f);
      iVar6 = iVar6 + -1;
    } while (uVar10 < uVar11);
  }
  if ((uVar12 & 0xfc0) == 0) {
    pCVar9 = (CloudNode *)0x0;
  }
  else {
    uVar11 = (ulong)(uVar12 >> 6 & 0x3f);
    do {
      iVar6 = pCut->pNodes[uVar11 - 1];
      if (((long)iVar6 < 0) || (pVVar2 = p->pNtk->vObjs, pVVar2->nSize <= iVar6)) {
LAB_004e3e09:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      plVar3 = (long *)pVVar2->pArray[iVar6];
      uVar10 = plVar3[7];
      Hop_ObjCleanData_rec((Hop_Obj_t *)(uVar10 & 0xfffffffffffffffe));
      if (0 < *(int *)((long)plVar3 + 0x1c)) {
        lVar7 = 0;
        do {
          uVar4 = *(undefined8 *)
                   (*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                             (long)*(int *)(plVar3[4] + lVar7 * 4) * 8) + 0x40);
          if ((short)((ulong)uVar4 >> 0x10) == 0) {
            __assert_fail("((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkCut.c"
                          ,0x6d,"CloudNode *Lpk_CutTruthBdd(Lpk_Man_t *, Lpk_Cut_t *)");
          }
          pVVar2 = pMan->vPis;
          if (pVVar2->nSize <= lVar7) goto LAB_004e3e09;
          *(undefined8 *)pVVar2->pArray[lVar7] = uVar4;
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)plVar3 + 0x1c));
      }
      pCVar8 = Lpk_CutTruthBdd_rec(dd,pMan,(Hop_Obj_t *)(uVar10 & 0xfffffffffffffffe),
                                   *(uint *)pCut & 0x3f);
      pCVar9 = (CloudNode *)((ulong)pCVar8 ^ 1);
      if ((*(byte *)(plVar3 + 7) & 1) == 0) {
        pCVar9 = pCVar8;
      }
      plVar3[8] = (long)pCVar9;
      bVar5 = 1 < (long)uVar11;
      uVar11 = uVar11 - 1;
    } while (bVar5);
  }
  return pCVar9;
}

Assistant:

CloudNode * Lpk_CutTruthBdd( Lpk_Man_t * p, Lpk_Cut_t * pCut )
{
    CloudManager * dd = p->pDsdMan->dd;
    Hop_Man_t * pManHop = (Hop_Man_t *)p->pNtk->pManFunc;
    Hop_Obj_t * pObjHop;
    Abc_Obj_t * pObj, * pFanin;
    CloudNode * pTruth = NULL; // Suppress "might be used uninitialized"
    int i, k;

//    return NULL;
//    Lpk_NodePrintCut( p, pCut );
    // initialize the leaves
    Lpk_CutForEachLeaf( p->pNtk, pCut, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)dd->vars[pCut->nLeaves-1-i];

    // construct truth table in the topological order
    Lpk_CutForEachNodeReverse( p->pNtk, pCut, pObj, i )
    {
        // get the local AIG
        pObjHop = Hop_Regular((Hop_Obj_t *)pObj->pData);
        // clean the data field of the nodes in the AIG subgraph
        Hop_ObjCleanData_rec( pObjHop );
        // set the initial truth tables at the fanins
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            assert( ((unsigned)(ABC_PTRUINT_T)pFanin->pCopy) & 0xffff0000 );
            Hop_ManPi( pManHop, k )->pData = pFanin->pCopy;
        }
        // compute the truth table of internal nodes
        pTruth = Lpk_CutTruthBdd_rec( dd, pManHop, pObjHop, pCut->nLeaves );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            pTruth = Cloud_Not(pTruth);
        // set the truth table at the node
        pObj->pCopy = (Abc_Obj_t *)pTruth;
        
    }

//    Cloud_bddPrint( dd, pTruth );
//    printf( "Bdd size = %d. Total nodes = %d.\n", Cloud_DagSize( dd, pTruth ), dd->nNodesCur-dd->nVars-1 );
    return pTruth;
}